

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_BrepFaceSide ** __thiscall
ON_SimpleArray<const_ON_BrepFaceSide_*>::SetCapacity
          (ON_SimpleArray<const_ON_BrepFaceSide_*> *this,size_t new_capacity)

{
  int iVar1;
  undefined4 extraout_var;
  uint local_2c;
  int capacity;
  size_t new_capacity_local;
  ON_SimpleArray<const_ON_BrepFaceSide_*> *this_local;
  
  if (this->m_capacity == 0) {
    this->m_a = (ON_BrepFaceSide **)0x0;
    this->m_count = 0;
  }
  if ((new_capacity == 0) || (0xfffffffe < new_capacity)) {
    local_2c = 0;
  }
  else {
    local_2c = (uint)new_capacity;
  }
  if (local_2c != this->m_capacity) {
    if ((int)local_2c < 1) {
      if (this->m_a != (ON_BrepFaceSide **)0x0) {
        (*this->_vptr_ON_SimpleArray[3])(this,this->m_a,0);
        this->m_a = (ON_BrepFaceSide **)0x0;
        this->m_capacity = 0;
        this->m_count = 0;
      }
    }
    else {
      if ((int)local_2c < this->m_count) {
        this->m_count = local_2c;
      }
      iVar1 = (*this->_vptr_ON_SimpleArray[3])(this,this->m_a,(ulong)local_2c);
      this->m_a = (ON_BrepFaceSide **)CONCAT44(extraout_var,iVar1);
      if (this->m_a == (ON_BrepFaceSide **)0x0) {
        this->m_capacity = 0;
        this->m_count = 0;
      }
      else {
        if (this->m_capacity < (int)local_2c) {
          memset(this->m_a + this->m_capacity,0,(long)(int)(local_2c - this->m_capacity) << 3);
        }
        this->m_capacity = local_2c;
      }
    }
  }
  return this->m_a;
}

Assistant:

T* ON_SimpleArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }

  // sets capacity to input value
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX) 
               ? (int)new_capacity 
               : 0;
  if ( capacity != m_capacity ) {
    if( capacity > 0 ) {
      if ( m_count > capacity )
        m_count = capacity;
      // NOTE: Realloc() does an allocation if the first argument is nullptr.
      m_a = Realloc( m_a, capacity );
      if ( m_a ) {
        if ( capacity > m_capacity ) {
          // zero new memory
          memset( (void*) (m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
        }
        m_capacity = capacity;
      }
      else {
        // out of memory
        m_count = m_capacity = 0;
      }
    }
    else if (m_a) {
      Realloc(m_a,0);
      m_a = 0;
      m_count = m_capacity = 0;
    }
  }
  return m_a;
}